

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<SubArray,Macro>::emplace<Macro_const&>(QHash<SubArray,_Macro> *this,SubArray *key,Macro *args)

{
  long lVar1;
  bool bVar2;
  SubArray *in_RSI;
  QHash<SubArray,_Macro> *in_RDI;
  long in_FS_OFFSET;
  QHash<SubArray,_Macro> copy;
  Macro *in_stack_ffffffffffffff68;
  Macro *in_stack_ffffffffffffff70;
  Macro *in_stack_ffffffffffffff78;
  SubArray *in_stack_ffffffffffffff80;
  piter local_58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<SubArray,_Macro>::isDetached((QHash<SubArray,_Macro> *)in_stack_ffffffffffffff70);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<SubArray,_Macro>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      Macro::Macro(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_58 = (piter)QHash<SubArray,_Macro>::emplace_helper<Macro>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff78);
      Macro::~Macro(in_stack_ffffffffffffff70);
    }
    else {
      local_58 = (piter)emplace_helper<Macro_const&>
                                  (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  else {
    QHash<SubArray,_Macro>::QHash
              ((QHash<SubArray,_Macro> *)in_stack_ffffffffffffff70,
               (QHash<SubArray,_Macro> *)in_stack_ffffffffffffff68);
    QHash<SubArray,_Macro>::detach((QHash<SubArray,_Macro> *)in_stack_ffffffffffffff70);
    local_58 = (piter)emplace_helper<Macro_const&>
                                (in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QHash<SubArray,_Macro>::~QHash((QHash<SubArray,_Macro> *)in_stack_ffffffffffffff70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_58;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }